

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.hpp
# Opt level: O1

void __thiscall helics::apps::SignalGenerator::~SignalGenerator(SignalGenerator *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_SignalGenerator = (_func_int **)&PTR__SignalGenerator_00522b30;
  pcVar1 = (this->mName)._M_dataplus._M_p;
  paVar2 = &(this->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~SignalGenerator() = default;